

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O2

void S_ParseMusInfo(void)

{
  bool bVar1;
  int iVar2;
  level_info_t *plVar3;
  Node *pNVar4;
  FName music;
  int lastlump;
  FScanner sc;
  
  lastlump = 0;
  while( true ) {
    iVar2 = FWadCollection::FindLump(&Wads,"MUSINFO",&lastlump,false);
    if (iVar2 == -1) break;
    FScanner::FScanner(&sc,iVar2);
    while( true ) {
      bVar1 = FScanner::GetString(&sc);
      if (!bVar1) break;
      plVar3 = FindLevelInfo(sc.String,true);
      if (plVar3 == (level_info_t *)0x0) {
        FScanner::ScriptMessage(&sc,"Unknown map \'%s\'",sc.String);
      }
      while( true ) {
        bVar1 = FScanner::CheckNumber(&sc);
        iVar2 = sc.Number;
        if (!bVar1) break;
        FScanner::MustGetString(&sc);
        if (0 < iVar2) {
          FName::FName(&music,sc.String);
          if (plVar3 != (level_info_t *)0x0) {
            pNVar4 = TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::GetNode
                               (&plVar3->MusicMap,iVar2);
            (pNVar4->Pair).Value.Index = music.Index;
          }
        }
      }
    }
    FScanner::~FScanner(&sc);
  }
  return;
}

Assistant:

void S_ParseMusInfo()
{
	int lastlump = 0, lump;

	while ((lump = Wads.FindLump ("MUSINFO", &lastlump)) != -1)
	{
		FScanner sc(lump);

		while (sc.GetString())
		{
			level_info_t *map = FindLevelInfo(sc.String);

			if (map == NULL)
			{
				// Don't abort for invalid maps
				sc.ScriptMessage("Unknown map '%s'", sc.String);
			}
			while (sc.CheckNumber())
			{
				int index = sc.Number;
				sc.MustGetString();
				if (index > 0)
				{
					FName music = sc.String;
					if (map != NULL)
					{
						map->MusicMap[index] = music;
					}
				}
			}
		}
	}
}